

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_pool.hpp
# Opt level: O1

Lazy<void> __thiscall
coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>::reconnect
          (client_pool<cinatra::coro_http_client,_coro_io::io_context_pool> *this,
          unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
          *client,weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                  *watcher)

{
  ImplicitProducer *pIVar1;
  element_type *peVar2;
  
  peVar2 = (element_type *)operator_new(0xa0,(nothrow_t *)&std::nothrow);
  if (peVar2 == (element_type *)0x0) {
    (this->
    super_enable_shared_from_this<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
    )._M_weak_this.
    super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
  }
  else {
    *(code **)&(peVar2->
               super_enable_shared_from_this<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
               )._M_weak_this.
               super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
         = reconnect;
    ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(peVar2->
            super_enable_shared_from_this<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
            )._M_weak_this.
            super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
    + 8))->_M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)reconnect;
    *(unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_> **)
     ((long)&(peVar2->free_clients_).queue_[0].initialImplicitProducerHashEntries + 8) = client;
    pIVar1 = (ImplicitProducer *)
             (watcher->
             super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
             )._M_refcount._M_pi;
    (((ImplicitProducerKVP *)
     ((long)&(peVar2->free_clients_).queue_[0].initialImplicitProducerHashEntries + 0x10))->key).
    super___atomic_base<unsigned_long>._M_i =
         (__int_type)
         (watcher->
         super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
         )._M_ptr;
    *(ImplicitProducer **)
     ((long)&(peVar2->free_clients_).queue_[0].initialImplicitProducerHashEntries + 0x18) = pIVar1;
    (watcher->
    super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
    )._M_ptr = (element_type *)0x0;
    (watcher->
    super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
    )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (peVar2->free_clients_).queue_[0].initialBlockPoolIndex.super___atomic_base<unsigned_long>._M_i
         = 0;
    (peVar2->free_clients_).queue_[0].initialBlockPool = (Block *)0x0;
    (peVar2->free_clients_).queue_[0].producerListTail._M_b = (__base_type)0x0;
    *(undefined8 *)&(peVar2->free_clients_).queue_[0].producerCount = 0;
    (this->
    super_enable_shared_from_this<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
    )._M_weak_this.
    super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar2;
    *(undefined1 *)
     ((long)&(peVar2->free_clients_).queue_[0].initialImplicitProducerHashEntries + 0x34) = 0;
  }
  return (LazyBase<void,_false>)(LazyBase<void,_false>)this;
}

Assistant:

static async_simple::coro::Lazy<void> reconnect(
      std::unique_ptr<client_t>& client, std::weak_ptr<client_pool> watcher) {
    using namespace std::chrono_literals;
    std::shared_ptr<client_pool> self = watcher.lock();
    uint32_t i = UINT32_MAX;  // (at least connect once)
    do {
      CINATRA_LOG_TRACE << "try to reconnect client{" << client.get()
                        << "},host:{" << client->get_host() << ":"
                        << client->get_port() << "}, try count:" << i + 1
                        << "max retry limit:"
                        << self->pool_config_.connect_retry_count;
      auto [ok, cost_time] = co_await reconnect_impl(client, self);
      if (ok) {
        CINATRA_LOG_TRACE << "reconnect client{" << client.get() << "} success";
        co_return;
      }
      CINATRA_LOG_TRACE << "reconnect client{" << client.get()
                        << "} failed. If client close:{" << client->has_closed()
                        << "}";
      auto wait_time = rand_time(
          (self->pool_config_.reconnect_wait_time - cost_time) / 1ms * 1ms);
      self = nullptr;
      if (wait_time.count() > 0)
        co_await coro_io::sleep_for(wait_time, &client->get_executor());
      self = watcher.lock();
      ++i;
    } while (i < self->pool_config_.connect_retry_count);
    CINATRA_LOG_WARNING << "reconnect client{" << client.get() << "},host:{"
                        << client->get_host() << ":" << client->get_port()
                        << "} out of max limit, stop retry. connect failed";
    alive_detect(client->get_config(), std::move(self)).start([](auto&&) {
    });
    client = nullptr;
  }